

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O0

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CCompoundStm *statement)

{
  bool bVar1;
  CExpStatement *this_00;
  CConstExpression *this_01;
  pointer pIVar2;
  CSeqStatement *this_02;
  CStatementWrapper *pCVar3;
  pointer pIVar4;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_b8;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_b0;
  undefined1 local_a1;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_a0;
  undefined1 local_91;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_90;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_88;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_80;
  unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> local_78 [8];
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_70;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> compound;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_60;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> rightStatement;
  type leftStatement;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_48;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_40 [3];
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_28;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_20;
  CCompoundStm *local_18;
  CCompoundStm *statement_local;
  CBuildVisitor *this_local;
  
  local_18 = statement;
  statement_local = (CCompoundStm *)this;
  std::operator<<((ostream *)&std::cout,"IRT builder: CCompound\n");
  bVar1 = std::operator==(&local_18->leftStatement,(nullptr_t)0x0);
  if (bVar1) {
    pCVar3 = (CStatementWrapper *)operator_new(0x10);
    this_00 = (CExpStatement *)operator_new(0x10);
    this_01 = (CConstExpression *)operator_new(0x10);
    IRT::CConstExpression::CConstExpression(this_01,0);
    std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
    unique_ptr<std::default_delete<IRT::CExpression_const>,void>
              ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
               &local_48,(pointer)this_01);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(local_40,&local_48);
    IRT::CExpStatement::CExpStatement(this_00,local_40);
    std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
    unique_ptr<std::default_delete<IRT::CStatement_const>,void>
              ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
               &local_28,(pointer)this_00);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (&local_20,&local_28);
    IRT::CStatementWrapper::CStatementWrapper(pCVar3,&local_20);
    updateSubtreeWrapper(this,(ISubtreeWrapper *)pCVar3);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_20);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_28);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(local_40);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_48);
  }
  else {
    pIVar2 = std::unique_ptr<IStatement,_std::default_delete<IStatement>_>::operator->
                       (&local_18->leftStatement);
    (**(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
    std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::unique_ptr
              ((unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> *)
               &rightStatement,&this->wrapper);
    pIVar2 = std::unique_ptr<IStatement,_std::default_delete<IStatement>_>::operator->
                       (&local_18->rightStatement);
    (**(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->wrapper);
    if (bVar1) {
      pIVar4 = std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::
               operator->(&this->wrapper);
      (*pIVar4->_vptr_ISubtreeWrapper[1])(&compound);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      unique_ptr(&local_60,&compound);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&compound);
      this_02 = (CSeqStatement *)operator_new(0x18);
      local_91 = 1;
      pIVar4 = std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::
               operator->((unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
                           *)&rightStatement);
      (*pIVar4->_vptr_ISubtreeWrapper[1])(&local_88);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      unique_ptr(&local_80,&local_88);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      unique_ptr(&local_90,&local_60);
      IRT::CSeqStatement::CSeqStatement(this_02,&local_80,&local_90);
      local_91 = 0;
      std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
      unique_ptr<std::default_delete<IRT::CStatement_const>,void>(local_78,(pointer)this_02);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      unique_ptr(&local_70,
                 (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                 local_78);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                  local_78);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_90);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_80);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_88);
      pCVar3 = (CStatementWrapper *)operator_new(0x10);
      local_a1 = 1;
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      unique_ptr(&local_a0,&local_70);
      IRT::CStatementWrapper::CStatementWrapper(pCVar3,&local_a0);
      local_a1 = 0;
      updateSubtreeWrapper(this,(ISubtreeWrapper *)pCVar3);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_a0);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_70);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_60);
    }
    else {
      pCVar3 = (CStatementWrapper *)operator_new(0x10);
      pIVar4 = std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::
               operator->((unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
                           *)&rightStatement);
      (*pIVar4->_vptr_ISubtreeWrapper[1])(&local_b8);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      unique_ptr(&local_b0,&local_b8);
      IRT::CStatementWrapper::CStatementWrapper(pCVar3,&local_b0);
      updateSubtreeWrapper(this,(ISubtreeWrapper *)pCVar3);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_b0);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_b8);
    }
    std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::~unique_ptr
              ((unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> *)
               &rightStatement);
  }
  return;
}

Assistant:

void CBuildVisitor::Visit( CCompoundStm &statement ) {
    std::cout << "IRT builder: CCompound\n";
    if ( statement.leftStatement == NULL ) {
        // fake statement
        updateSubtreeWrapper( new IRT::CStatementWrapper( std::move( std::unique_ptr<const IRT::CStatement>(
                new IRT::CExpStatement(
                        std::move( std::unique_ptr<const IRT::CExpression>( new IRT::CConstExpression( 0 )))
                )
        ))));
    } else {
        statement.leftStatement->Accept( *this );
        auto leftStatement = std::move( wrapper );
        statement.rightStatement->Accept( *this );

        if ( wrapper ) {
            std::unique_ptr<const IRT::CStatement> rightStatement = std::move( wrapper->ToStatement( ));
            std::unique_ptr<const IRT::CStatement> compound = std::move( std::unique_ptr<const IRT::CStatement>(
                    new IRT::CSeqStatement( std::move( leftStatement->ToStatement( )), std::move( rightStatement ))));
            updateSubtreeWrapper( new IRT::CStatementWrapper( std::move( compound )));
        } else {
            updateSubtreeWrapper( new IRT::CStatementWrapper( std::move( leftStatement->ToStatement( ))));
        }
    }
}